

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

string_t duckdb::SubstringEmptyString(Vector *result)

{
  idx_t in_RDX;
  char *dataptr;
  string_t sVar1;
  string_t result_string;
  undefined1 local_10 [16];
  
  local_10 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)result,(Vector *)0x0,in_RDX);
  if ((uint)local_10._0_4_ < 0xd) {
    switchD_00569a20::default
              (local_10 + (ulong)(local_10._0_4_ & 0xf) + 4,0,0xc - (ulong)(local_10._0_4_ & 0xf));
  }
  else {
    local_10._4_4_ = *(undefined4 *)local_10._8_8_;
  }
  sVar1.value.pointer.ptr = (char *)local_10._8_8_;
  sVar1.value._0_8_ = local_10._0_8_;
  return (string_t)sVar1.value;
}

Assistant:

string_t SubstringEmptyString(Vector &result) {
	auto result_string = StringVector::EmptyString(result, 0);
	result_string.Finalize();
	return result_string;
}